

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

ikcpcb * ikcp_create(IUINT32 conv,void *user)

{
  char *pcVar1;
  ikcpcb *kcp;
  void *user_local;
  ikcpcb *piStack_10;
  IUINT32 conv_local;
  
  piStack_10 = (ikcpcb *)ikcp_malloc(0x110);
  if (piStack_10 == (ikcpcb *)0x0) {
    piStack_10 = (ikcpcb *)0x0;
  }
  else {
    piStack_10->conv = conv;
    piStack_10->user = user;
    piStack_10->snd_una = 0;
    piStack_10->snd_nxt = 0;
    piStack_10->rcv_nxt = 0;
    piStack_10->ts_recent = 0;
    piStack_10->ts_lastack = 0;
    piStack_10->ts_probe = 0;
    piStack_10->probe_wait = 0;
    piStack_10->snd_wnd = 0x20;
    piStack_10->rcv_wnd = 0x80;
    piStack_10->rmt_wnd = 0x80;
    piStack_10->cwnd = 0;
    piStack_10->incr = 0;
    piStack_10->probe = 0;
    piStack_10->mtu = 0x578;
    piStack_10->mss = piStack_10->mtu - 0x18;
    piStack_10->stream = 0;
    pcVar1 = (char *)ikcp_malloc((ulong)((piStack_10->mtu + 0x18) * 3));
    piStack_10->buffer = pcVar1;
    if (piStack_10->buffer == (char *)0x0) {
      ikcp_free(piStack_10);
      piStack_10 = (ikcpcb *)0x0;
    }
    else {
      (piStack_10->snd_queue).next = &piStack_10->snd_queue;
      (piStack_10->snd_queue).prev = &piStack_10->snd_queue;
      (piStack_10->rcv_queue).next = &piStack_10->rcv_queue;
      (piStack_10->rcv_queue).prev = &piStack_10->rcv_queue;
      (piStack_10->snd_buf).next = &piStack_10->snd_buf;
      (piStack_10->snd_buf).prev = &piStack_10->snd_buf;
      (piStack_10->rcv_buf).next = &piStack_10->rcv_buf;
      (piStack_10->rcv_buf).prev = &piStack_10->rcv_buf;
      piStack_10->nrcv_buf = 0;
      piStack_10->nsnd_buf = 0;
      piStack_10->nrcv_que = 0;
      piStack_10->nsnd_que = 0;
      piStack_10->state = 0;
      piStack_10->acklist = (IUINT32 *)0x0;
      piStack_10->ackblock = 0;
      piStack_10->ackcount = 0;
      piStack_10->rx_srtt = 0;
      piStack_10->rx_rttval = 0;
      piStack_10->rx_rto = 200;
      piStack_10->rx_minrto = 100;
      piStack_10->current = 0;
      piStack_10->interval = 100;
      piStack_10->ts_flush = 100;
      piStack_10->nodelay = 0;
      piStack_10->updated = 0;
      piStack_10->logmask = 0;
      piStack_10->ssthresh = 2;
      piStack_10->fastresend = 0;
      piStack_10->fastlimit = 5;
      piStack_10->nocwnd = 0;
      piStack_10->xmit = 0;
      piStack_10->dead_link = 0x14;
      piStack_10->output = (_func_int_char_ptr_int_IKCPCB_ptr_void_ptr *)0x0;
      piStack_10->writelog = (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0;
    }
  }
  return piStack_10;
}

Assistant:

ikcpcb* ikcp_create(IUINT32 conv, void *user)
{
	ikcpcb *kcp = (ikcpcb*)ikcp_malloc(sizeof(struct IKCPCB));
	if (kcp == NULL) return NULL;
	kcp->conv = conv;
	kcp->user = user;
	kcp->snd_una = 0;
	kcp->snd_nxt = 0;
	kcp->rcv_nxt = 0;
	kcp->ts_recent = 0;
	kcp->ts_lastack = 0;
	kcp->ts_probe = 0;
	kcp->probe_wait = 0;
	kcp->snd_wnd = IKCP_WND_SND;
	kcp->rcv_wnd = IKCP_WND_RCV;
	kcp->rmt_wnd = IKCP_WND_RCV;
	kcp->cwnd = 0;
	kcp->incr = 0;
	kcp->probe = 0;
	kcp->mtu = IKCP_MTU_DEF;
	kcp->mss = kcp->mtu - IKCP_OVERHEAD;
	kcp->stream = 0;

	kcp->buffer = (char*)ikcp_malloc((kcp->mtu + IKCP_OVERHEAD) * 3);
	if (kcp->buffer == NULL) {
		ikcp_free(kcp);
		return NULL;
	}

	iqueue_init(&kcp->snd_queue);
	iqueue_init(&kcp->rcv_queue);
	iqueue_init(&kcp->snd_buf);
	iqueue_init(&kcp->rcv_buf);
	kcp->nrcv_buf = 0;
	kcp->nsnd_buf = 0;
	kcp->nrcv_que = 0;
	kcp->nsnd_que = 0;
	kcp->state = 0;
	kcp->acklist = NULL;
	kcp->ackblock = 0;
	kcp->ackcount = 0;
	kcp->rx_srtt = 0;
	kcp->rx_rttval = 0;
	kcp->rx_rto = IKCP_RTO_DEF;
	kcp->rx_minrto = IKCP_RTO_MIN;
	kcp->current = 0;
	kcp->interval = IKCP_INTERVAL;
	kcp->ts_flush = IKCP_INTERVAL;
	kcp->nodelay = 0;
	kcp->updated = 0;
	kcp->logmask = 0;
	kcp->ssthresh = IKCP_THRESH_INIT;
	kcp->fastresend = 0;
	kcp->fastlimit = IKCP_FASTACK_LIMIT;
	kcp->nocwnd = 0;
	kcp->xmit = 0;
	kcp->dead_link = IKCP_DEADLINK;
	kcp->output = NULL;
	kcp->writelog = NULL;

	return kcp;
}